

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall miniros::Publication::processPublishQueue(Publication *this)

{
  const_iterator __position;
  iterator __last;
  iterator this_00;
  long in_RDI;
  bool bVar1;
  SerializedMessage *unaff_retaddr;
  Publication *in_stack_00000008;
  iterator end;
  iterator it;
  scoped_lock<std::mutex> lock;
  V_SerializedMessage queue;
  mutex_type *in_stack_ffffffffffffff68;
  __normal_iterator<const_miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
  *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff80;
  __normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
  local_68;
  SerializedMessage *local_60;
  SerializedMessage *local_58;
  __normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
  in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  
  std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::vector
            ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
             0x48a356);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = (*(byte *)(in_RDI + 0x138) & 1) == 0;
  if (bVar1) {
    __last = std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::
             end((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
                 in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<miniros::SerializedMessage_const*,std::vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>>>
    ::__normal_iterator<miniros::SerializedMessage*>
              (in_stack_ffffffffffffff70,
               (__normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
                *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 =
         (__normal_iterator<const_miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
          *)(in_RDI + 0x180);
    this_00 = std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::
              begin((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                     *)in_stack_ffffffffffffff68);
    local_58 = (SerializedMessage *)
               std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
               ::end((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                      *)in_stack_ffffffffffffff68);
    __position._M_current._4_4_ = in_stack_ffffffffffffffcc;
    __position._M_current._0_4_ = in_stack_ffffffffffffffc8;
    in_stack_ffffffffffffff80 =
         std::vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>>::
         insert<__gnu_cxx::__normal_iterator<miniros::SerializedMessage*,std::vector<miniros::SerializedMessage,std::allocator<miniros::SerializedMessage>>>,void>
                   (this_00._M_current,__position,in_stack_ffffffffffffffc0,__last._M_current);
    local_60 = in_stack_ffffffffffffff80._M_current;
    std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::clear
              ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
               0x48a424);
  }
  uVar2 = (uint)!bVar1;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48a436);
  if ((uVar2 == 0) &&
     (bVar1 = std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::
              empty((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                     *)in_stack_ffffffffffffff80._M_current), !bVar1)) {
    local_68._M_current =
         (SerializedMessage *)
         std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::begin
                   ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>
                     *)in_stack_ffffffffffffff68);
    std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::end
              ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
               in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      __gnu_cxx::
      __normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
      ::operator*(&local_68);
      enqueueMessage(in_stack_00000008,unaff_retaddr);
      __gnu_cxx::
      __normal_iterator<miniros::SerializedMessage_*,_std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>_>
      ::operator++(&local_68);
    }
  }
  std::vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>::~vector
            ((vector<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_> *)
             in_stack_ffffffffffffff80._M_current);
  return;
}

Assistant:

void Publication::processPublishQueue()
{
  V_SerializedMessage queue;
  {
    std::scoped_lock<std::mutex> lock(publish_queue_mutex_);

    if (dropped_)
    {
      return;
    }

    queue.insert(queue.end(), publish_queue_.begin(), publish_queue_.end());
    publish_queue_.clear();
  }

  if (queue.empty())
  {
    return;
  }

  V_SerializedMessage::iterator it = queue.begin();
  V_SerializedMessage::iterator end = queue.end();
  for (; it != end; ++it)
  {
    enqueueMessage(*it);
  }
}